

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_suite.hpp
# Opt level: O2

void __thiscall
iutest::
TypedTestSuite<iutest::Types<int,_float,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None>_>
::~TypedTestSuite(TypedTestSuite<iutest::Types<int,_float,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None>_>
                  *this)

{
  ~TypedTestSuite(this);
  operator_delete(this,0xd0);
  return;
}

Assistant:

class TypedTestSuite IUTEST_CXX_FINAL : public TestSuite
{
public:
    typedef T   TypeParam;  //!< 型

protected:
    /**
     * @brief   コンストラクタ
     * @param [in]  testsuite_name  = TestSuite 名
     * @param [in]  id              = TestSuite ID
     * @param [in]  setup           = テスト事前実行関数
     * @param [in]  teardown        = テスト事後実行関数
    */
    TypedTestSuite(const ::std::string& testsuite_name, TestTypeId id, SetUpMethod setup, TearDownMethod teardown)
        : TestSuite(testsuite_name, id, setup, teardown)
        , m_type_param(detail::GetTypeNameProxy<TypeParam>::GetTypeName())
    {
    }

public:
    /** type param 文字列の取得 */
    virtual const char* type_param() const IUTEST_CXX_OVERRIDE
    {
        return m_type_param.empty() ? NULL : m_type_param.c_str();
    }